

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::Skip(CopyingInputStreamAdaptor *this,int count)

{
  uint uVar1;
  LogMessage *other;
  LogFinisher local_6d;
  int skipped;
  byte local_59;
  LogMessage local_58;
  uint local_1c;
  CopyingInputStreamAdaptor *pCStack_18;
  int count_local;
  CopyingInputStreamAdaptor *this_local;
  
  local_59 = 0;
  local_1c = count;
  pCStack_18 = this;
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x10d);
    local_59 = 1;
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=(&local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  if ((this->failed_ & 1U) == 0) {
    if (this->backup_bytes_ < (int)local_1c) {
      local_1c = local_1c - this->backup_bytes_;
      this->backup_bytes_ = 0;
      uVar1 = (*this->copying_stream_->_vptr_CopyingInputStream[3])
                        (this->copying_stream_,(ulong)local_1c);
      this->position_ = (long)(int)uVar1 + this->position_;
      this_local._7_1_ = uVar1 == local_1c;
    }
    else {
      this->backup_bytes_ = this->backup_bytes_ - local_1c;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CopyingInputStreamAdaptor::Skip(int count) {
  GOOGLE_CHECK_GE(count, 0);

  if (failed_) {
    // Already failed on a previous read.
    return false;
  }

  // First skip any bytes left over from a previous BackUp().
  if (backup_bytes_ >= count) {
    // We have more data left over than we're trying to skip.  Just chop it.
    backup_bytes_ -= count;
    return true;
  }

  count -= backup_bytes_;
  backup_bytes_ = 0;

  int skipped = copying_stream_->Skip(count);
  position_ += skipped;
  return skipped == count;
}